

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O3

int sat_solver3_propagate(sat_solver3 *s)

{
  ABC_INT64_T *pAVar1;
  uint *puVar2;
  veci *pvVar3;
  uint uVar4;
  clause cVar5;
  veci *pvVar6;
  veci *pvVar7;
  uint uVar8;
  uint uVar9;
  uint *puVar10;
  int *piVar11;
  char *pcVar12;
  int iVar13;
  clause cVar14;
  clause *pcVar15;
  uint uVar16;
  uint uVar17;
  clause cVar18;
  uint uVar19;
  uint *puVar20;
  uint *puVar21;
  ulong uVar22;
  bool bVar23;
  
  do {
    iVar13 = s->qhead;
    if (s->qtail <= iVar13) {
      return 0;
    }
    pvVar6 = s->wlists;
    s->qhead = iVar13 + 1;
    uVar4 = s->trail[iVar13];
    puVar20 = (uint *)pvVar6[(int)uVar4].ptr;
    iVar13 = pvVar6[(int)uVar4].size;
    pAVar1 = &(s->stats).propagations;
    *pAVar1 = *pAVar1 + 1;
    puVar21 = puVar20;
    if ((long)iVar13 < 1) {
      uVar17 = 0;
    }
    else {
      puVar2 = puVar20 + iVar13;
      cVar18 = (clause)(uVar4 ^ 1);
      uVar17 = 0;
      do {
        uVar8 = *puVar20;
        if ((uVar8 & 1) == 0) {
          if (uVar8 == 0) {
            puVar10 = (uint *)0x0;
          }
          else {
            uVar9 = (s->Mem).uPageMask & uVar8;
            if (uVar9 == 0) {
              __assert_fail("k",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                            ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
            }
            puVar10 = (uint *)((s->Mem).pPages[(int)uVar8 >> ((byte)(s->Mem).nPageSize & 0x1f)] +
                              (int)uVar9);
          }
          cVar14 = *(clause *)(puVar10 + 1);
          cVar5 = *(clause *)(puVar10 + 2);
          if (cVar14 == cVar18) {
            *(clause *)(puVar10 + 1) = cVar5;
            *(clause *)(puVar10 + 2) = cVar18;
            cVar14 = cVar5;
          }
          else if (cVar5 != cVar18) {
            __assert_fail("lits[1] == false_lit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver3.c"
                          ,0x427,"int sat_solver3_propagate(sat_solver3 *)");
          }
          if (((uint)cVar14 & 1) == (int)s->assigns[(int)cVar14 >> 1]) {
            *puVar21 = *puVar20;
            puVar21 = puVar21 + 1;
          }
          else {
            uVar8 = *puVar10 >> 9 & 0xfffffffc;
            if (8 < uVar8) {
              pcVar15 = (clause *)(puVar10 + 3);
              do {
                cVar14 = *pcVar15;
                if (((uint)cVar14 & 1 ^ (int)s->assigns[(int)cVar14 >> 1]) != 1) {
                  *(clause *)(puVar10 + 2) = cVar14;
                  *pcVar15 = cVar18;
                  uVar22 = (long)(int)puVar10[2] ^ 1;
                  pvVar7 = s->wlists;
                  pvVar3 = pvVar7 + uVar22;
                  uVar8 = *puVar20;
                  uVar9 = pvVar7[uVar22].size;
                  if (uVar9 == pvVar7[uVar22].cap) {
                    iVar13 = (uVar9 >> 1) * 3;
                    if ((int)uVar9 < 4) {
                      iVar13 = uVar9 * 2;
                    }
                    if (pvVar3->ptr == (int *)0x0) {
                      piVar11 = (int *)malloc((long)iVar13 << 2);
                    }
                    else {
                      piVar11 = (int *)realloc(pvVar3->ptr,(long)iVar13 << 2);
                    }
                    pvVar3->ptr = piVar11;
                    if (piVar11 == (int *)0x0) {
                      printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                             (double)pvVar3->cap * 9.5367431640625e-07,
                             (double)iVar13 * 9.5367431640625e-07);
                      fflush(_stdout);
                    }
                    pvVar3->cap = iVar13;
                    uVar9 = pvVar3->size;
                  }
                  pvVar3->size = uVar9 + 1;
                  pvVar3->ptr[(int)uVar9] = uVar8;
                  goto LAB_008ec04f;
                }
                pcVar15 = pcVar15 + 1;
              } while (pcVar15 < (clause *)((long)puVar10 + (ulong)uVar8 + 4));
            }
            uVar8 = *puVar20;
            *puVar21 = uVar8;
            uVar9 = *puVar10;
            if ((uVar9 & 1) != 0) {
              uVar8 = 0;
              if (0x7ff < uVar9) {
                uVar22 = 0;
                uVar8 = 0;
                uVar16 = 0;
                do {
                  uVar19 = 1 << ((byte)s->levels[(int)puVar10[uVar22 + 1] >> 1] & 0x1f);
                  bVar23 = (uVar16 >> (s->levels[(int)puVar10[uVar22 + 1] >> 1] & 0x1fU) & 1) != 0;
                  if (bVar23) {
                    uVar19 = 0;
                  }
                  uVar8 = (uVar8 + 1) - (uint)bVar23;
                  uVar16 = uVar16 | uVar19;
                  uVar22 = uVar22 + 1;
                } while (uVar9 >> 0xb != uVar22);
                uVar8 = (uVar8 & 0xff) << 3;
              }
              *puVar10 = uVar9 & 0xfffff807 | uVar8;
              uVar8 = *puVar20;
            }
            uVar9 = puVar10[1];
            iVar13 = (int)uVar9 >> 1;
            if (s->pFreqs[iVar13] == '\0') {
              s->pFreqs[iVar13] = '\x01';
            }
            puVar21 = puVar21 + 1;
            uVar16 = (uint)s->assigns[iVar13];
            if (uVar16 == 3) {
              s->assigns[iVar13] = (byte)uVar9 & 1;
              s->levels[iVar13] = (s->trail_lim).size;
              s->reasons[iVar13] = uVar8;
              iVar13 = s->qtail;
              s->qtail = iVar13 + 1;
              s->trail[iVar13] = uVar9;
            }
            else if ((uVar9 & 1) != uVar16) {
              uVar17 = *puVar20;
              while (puVar20 = puVar20 + 1, puVar20 < puVar2) {
                *puVar21 = *puVar20;
                puVar21 = puVar21 + 1;
              }
            }
          }
        }
        else {
          pcVar12 = s->assigns;
          if ((uVar8 >> 1 & 1) == (int)pcVar12[(int)uVar8 >> 2]) {
            *puVar21 = uVar8;
            puVar21 = puVar21 + 1;
          }
          else {
            *puVar21 = uVar8;
            uVar8 = *puVar20;
            iVar13 = (int)uVar8 >> 2;
            if (s->pFreqs[iVar13] == '\0') {
              s->pFreqs[iVar13] = '\x01';
              pcVar12 = s->assigns;
            }
            puVar21 = puVar21 + 1;
            uVar8 = (int)uVar8 >> 1;
            if ((int)pcVar12[iVar13] == 3) {
              pcVar12[iVar13] = (byte)uVar8 & 1;
              s->levels[iVar13] = (s->trail_lim).size;
              s->reasons[iVar13] = uVar4 * 2 + 1;
              iVar13 = s->qtail;
              s->qtail = iVar13 + 1;
              s->trail[iVar13] = uVar8;
            }
            else if ((uVar8 & 1) != (int)pcVar12[iVar13]) {
              uVar17 = s->hBinary;
              pcVar15 = s->binary;
              pcVar15[2] = cVar18;
              pcVar15[1] = (clause)((int)*puVar20 >> 1);
              while (puVar20 = puVar20 + 1, puVar20 < puVar2) {
                *puVar21 = *puVar20;
                puVar21 = puVar21 + 1;
              }
            }
          }
        }
LAB_008ec04f:
        puVar20 = puVar20 + 1;
      } while (puVar20 < puVar2);
    }
    uVar22 = (long)puVar21 - (long)pvVar6[(int)uVar4].ptr;
    pAVar1 = &(s->stats).inspects;
    *pAVar1 = *pAVar1 + ((long)uVar22 >> 2);
    iVar13 = (int)(uVar22 >> 2);
    if (pvVar6[(int)uVar4].size < iVar13) {
      __assert_fail("k <= v->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satVec.h"
                    ,0x30,"void veci_resize(veci *, int)");
    }
    pvVar6[(int)uVar4].size = iVar13;
    if (uVar17 != 0) {
      return uVar17;
    }
  } while( true );
}

Assistant:

int sat_solver3_propagate(sat_solver3* s)
{
    int     hConfl = 0;
    lit*    lits;
    lit false_lit;

    //printf("sat_solver3_propagate\n");
    while (hConfl == 0 && s->qtail - s->qhead > 0){
        lit p = s->trail[s->qhead++];

#ifdef TEST_CNF_LOAD
        int v = lit_var(p);
        if ( s->pCnfFunc )
        {
            if ( lit_sign(p) )
            {
                if ( (s->loads[v] & 1) == 0 )
                {
                    s->loads[v] ^= 1;
                    s->pCnfFunc( s->pCnfMan, p );
                }
            }
            else
            {
                if ( (s->loads[v] & 2) == 0 )
                {
                    s->loads[v] ^= 2;
                    s->pCnfFunc( s->pCnfMan, p );
                }
            }
        }
        {
#endif

        veci* ws    = sat_solver3_read_wlist(s,p);
        int*  begin = veci_begin(ws);
        int*  end   = begin + veci_size(ws);
        int*i, *j;

        s->stats.propagations++;
//        s->simpdb_props--;

        //printf("checking lit %d: "L_LIT"\n", veci_size(ws), L_lit(p));
        for (i = j = begin; i < end; ){
            if (clause_is_lit(*i)){

                int Lit = clause_read_lit(*i);
                if (var_value(s, lit_var(Lit)) == lit_sign(Lit)){
                    *j++ = *i++;
                    continue;
                }

                *j++ = *i;
                if (!sat_solver3_enqueue(s,clause_read_lit(*i),clause_from_lit(p))){
                    hConfl = s->hBinary;
                    (clause_begin(s->binary))[1] = lit_neg(p);
                    (clause_begin(s->binary))[0] = clause_read_lit(*i++);
                    // Copy the remaining watches:
                    while (i < end)
                        *j++ = *i++;
                }
            }else{

                clause* c = clause_read(s,*i);
                lits = clause_begin(c);

                // Make sure the false literal is data[1]:
                false_lit = lit_neg(p);
                if (lits[0] == false_lit){
                    lits[0] = lits[1];
                    lits[1] = false_lit;
                }
                assert(lits[1] == false_lit);

                // If 0th watch is true, then clause is already satisfied.
                if (var_value(s, lit_var(lits[0])) == lit_sign(lits[0]))
                    *j++ = *i;
                else{
                    // Look for new watch:
                    lit* stop = lits + clause_size(c);
                    lit* k;
                    for (k = lits + 2; k < stop; k++){
                        if (var_value(s, lit_var(*k)) != !lit_sign(*k)){
                            lits[1] = *k;
                            *k = false_lit;
                            veci_push(sat_solver3_read_wlist(s,lit_neg(lits[1])),*i);
                            goto next; }
                    }

                    *j++ = *i;
                    // Clause is unit under assignment:
                    if ( c->lrn )
                        c->lbd = sat_clause_compute_lbd(s, c);
                    if (!sat_solver3_enqueue(s,lits[0], *i)){
                        hConfl = *i++;
                        // Copy the remaining watches:
                        while (i < end)
                            *j++ = *i++;
                    }
                }
            }
        next:
            i++;
        }

        s->stats.inspects += j - veci_begin(ws);
        veci_resize(ws,j - veci_begin(ws));
#ifdef TEST_CNF_LOAD
        }
#endif
    }

    return hConfl;
}